

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexImage2DArrayDepthBufferCase::createTexture
          (TexImage2DArrayDepthBufferCase *this)

{
  int param;
  int width;
  int height;
  int depth;
  int iVar1;
  deInt32 rowPitch_00;
  int slicePitch_00;
  TransferFormat TVar2;
  reference pvVar3;
  size_type sVar4;
  PixelBufferAccess local_b0;
  undefined1 local_84 [8];
  Vec4 gMax;
  Vec4 gMin;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 buf;
  deUint32 tex;
  int slicePitch;
  int imageHeight;
  int rowPitch;
  int alignment;
  int rowLength;
  int pixelSize;
  deUint32 local_18;
  deUint32 dStack_14;
  TransferFormat transferFmt;
  TexImage2DArrayDepthBufferCase *this_local;
  
  TVar2 = glu::getTransferFormat((this->super_Texture2DArraySpecCase).m_texFormat);
  iVar1 = tcu::TextureFormat::getPixelSize(&(this->super_Texture2DArraySpecCase).m_texFormat);
  param = (this->super_Texture2DArraySpecCase).m_width;
  rowPitch_00 = deAlign32(param * iVar1,4);
  iVar1 = (this->super_Texture2DArraySpecCase).m_height;
  slicePitch_00 = iVar1 * rowPitch_00;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
             (long)(slicePitch_00 * (this->super_Texture2DArraySpecCase).m_numLayers));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),-1.5,-2.0,1.7,-1.5);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_84,2.0,1.5,-1.0,2.0);
  width = (this->super_Texture2DArraySpecCase).m_width;
  height = (this->super_Texture2DArraySpecCase).m_height;
  depth = (this->super_Texture2DArraySpecCase).m_numLayers;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_b0,&(this->super_Texture2DArraySpecCase).m_texFormat,width,height,depth,
             rowPitch_00,slicePitch_00,pvVar3);
  tcu::fillWithComponentGradients(&local_b0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_84);
  sglr::ContextWrapper::glGenBuffers
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glBindBuffer
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0x88ec
             ,(deUint32)
              data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  sglr::ContextWrapper::glBufferData
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0x88ec
             ,(long)(int)sVar4,pvVar3,0x88e4);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0x806e
             ,iVar1);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf2,
             param);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0x806d
             ,0);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf3,
             0);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf4,
             0);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             4);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0x8c1a
             ,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_);
  local_18 = TVar2.format;
  dStack_14 = TVar2.dataType;
  sglr::ContextWrapper::glTexImage3D
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0x8c1a
             ,0,this->m_internalFormat,(this->super_Texture2DArraySpecCase).m_width,
             (this->super_Texture2DArraySpecCase).m_height,
             (this->super_Texture2DArraySpecCase).m_numLayers,0,local_18,dStack_14,(void *)0x0);
  sglr::ContextWrapper::glDeleteBuffers
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_width;
		int						alignment		= 4;
		int						rowPitch		= deAlign32(rowLength*pixelSize, alignment);
		int						imageHeight		= m_height;
		int						slicePitch		= imageHeight*rowPitch;
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(slicePitch*m_numLayers);
		{
			const Vec4 gMin = Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4 gMax = Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, m_numLayers, rowPitch, slicePitch, &data[0]), gMin, gMax);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER, (int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	0);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		0);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	0);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, m_internalFormat, m_width, m_height, m_numLayers, 0, transferFmt.format, transferFmt.dataType, DE_NULL);
		glDeleteBuffers(1, &buf);
	}